

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
::clear_to_size(dense_hashtable<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>,_int,_std::hash<int>,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SelectKey,_google::dense_hash_map<int,_std::unique_ptr<int,_std::default_delete<int>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                *this,size_type new_num_buckets)

{
  pointer ppVar1;
  void *pvVar2;
  pointer ppVar3;
  unique_ptr<int,_std::default_delete<int>_> *puVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  float fVar8;
  
  if (this->table == (pointer)0x0) {
    ppVar3 = (pointer)malloc(new_num_buckets << 4);
  }
  else {
    sVar7 = this->num_buckets;
    if (sVar7 != 0) {
      lVar6 = 8;
      do {
        ppVar1 = this->table;
        pvVar2 = *(void **)((long)&ppVar1->first + lVar6);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
        *(undefined8 *)((long)&ppVar1->first + lVar6) = 0;
        lVar6 = lVar6 + 0x10;
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
    }
    if (this->num_buckets == new_num_buckets) goto LAB_00a5c652;
    ppVar3 = alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
             ::realloc_or_die((alloc_impl<google::libc_allocator_with_realloc<std::pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
                               *)&this->field_0x40,this->table,new_num_buckets);
  }
  this->table = ppVar3;
LAB_00a5c652:
  if (new_num_buckets != 0) {
    puVar4 = &this->table->second;
    sVar7 = new_num_buckets;
    do {
      ((pair<const_int,_std::unique_ptr<int,_std::default_delete<int>_>_> *)(puVar4 + -1))->first =
           (this->key_info).empty_key;
      (puVar4->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl = (int *)0x0;
      puVar4 = puVar4 + 2;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar8 = (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar5 = (ulong)fVar8;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  fVar8 = (float)new_num_buckets *
          (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
          shrink_factor_;
  uVar5 = (ulong)fVar8;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar8 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  (this->settings).super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }